

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

unsigned_fast_type math::wide_integer::detail::msb_helper<unsigned_short>(uint16_t *u)

{
  ushort uVar1;
  uint_fast16_t x;
  unsigned_fast_type r;
  uint16_t *u_local;
  
  x = 0;
  uVar1 = *u;
  if ((uVar1 & 0xff00) != 0) {
    uVar1 = uVar1 >> 8;
    x = 8;
  }
  if ((uVar1 & 0xf0) != 0) {
    uVar1 = uVar1 >> 4;
    x = x | 4;
  }
  if ((uVar1 & 0xc) != 0) {
    uVar1 = uVar1 >> 2;
    x = x | 2;
  }
  if ((uVar1 & 2) != 0) {
    x = x | 1;
  }
  return x;
}

Assistant:

constexpr auto msb_helper<std::uint16_t>(const std::uint16_t& u) -> unsigned_fast_type
  {
    auto r = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto x = static_cast<std::uint_fast16_t>(u);

    // Use O(log2[N]) binary-halving in an unrolled loop to find the msb.
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0xFF00)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(8))); r = static_cast<unsigned_fast_type>(r | UINT32_C(8)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x00F0)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(4))); r = static_cast<unsigned_fast_type>(r | UINT32_C(4)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x000C)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(2))); r = static_cast<unsigned_fast_type>(r | UINT32_C(2)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x0002)) != UINT16_C(0)) {                                                                              r = static_cast<unsigned_fast_type>(r | UINT32_C(1)); }

    return r;
  }